

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void bench_ellswift_xdh(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  int party;
  bench_ellswift_data *data;
  int i;
  uint local_10;
  
  local_10 = 0;
  while( true ) {
    if (in_ESI <= (int)local_10) {
      return;
    }
    iVar1 = secp256k1_ellswift_xdh
                      (*in_RDI,(long)in_RDI + (long)((int)local_10 % 0x21) + 0x4008,in_RDI + 0x801,
                       in_RDI + 0x801,(long)in_RDI + (long)((int)(local_10 + 0x10) % 0x21) + 0x4008,
                       local_10 & 1,_secp256k1_ellswift_xdh_hash_function_bip324,0);
    if (iVar1 != 1) break;
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/bench_impl.h"
          ,0x57,
          "test condition failed: secp256k1_ellswift_xdh(data->ctx, data->rnd64 + (i % 33), data->rnd64, data->rnd64, data->rnd64 + ((i + 16) % 33), party, secp256k1_ellswift_xdh_hash_function_bip324, NULL) == 1"
         );
  abort();
}

Assistant:

static void bench_ellswift_xdh(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        int party = i & 1;
        CHECK(secp256k1_ellswift_xdh(data->ctx,
                                     data->rnd64 + (i % 33),
                                     data->rnd64,
                                     data->rnd64,
                                     data->rnd64 + ((i + 16) % 33),
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL) == 1);
    }
}